

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_base_z2_operators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                *matrix)

{
  long lVar1;
  long *plVar2;
  pointer pVVar3;
  pointer ppEVar4;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  *pEVar5;
  node_ptr plVar6;
  node_ptr plVar7;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  *pvVar8;
  bool bVar9;
  long lVar10;
  const_iterator cVar11;
  node_ptr next;
  pointer ppEVar12;
  uint uVar13;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __first1_03;
  _Bit_const_iterator __first1_04;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __last1_03;
  _Bit_const_iterator __last1_04;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  _Bit_const_iterator __first2_03;
  _Bit_const_iterator __first2_04;
  undefined4 local_39c;
  char *local_398;
  char *local_390;
  shared_count sStack_388;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  *local_380;
  undefined **local_378;
  undefined1 local_370;
  undefined8 *local_368;
  char **local_360;
  long local_358;
  void *local_350;
  undefined4 local_348;
  long local_340;
  uint local_338;
  long local_330;
  undefined4 *local_328;
  long *local_320;
  undefined1 local_318 [8];
  node_ptr aplStack_310 [2];
  undefined8 uStack_300;
  _Bit_pointer local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2e0;
  undefined4 local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined4 local_2c0;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  local_2b8;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  local_298;
  undefined1 local_278 [8];
  undefined **local_270;
  node_ptr local_268;
  shared_count sStack_260;
  char *local_258;
  char *local_250;
  char *local_248;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  setcont;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setcont._M_t._M_impl.super__Rb_tree_header._M_header;
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setcont._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_350 = (void *)0x0;
  local_348 = 0;
  local_340 = 0;
  local_338 = 0;
  local_330 = 0;
  local_318._0_4_ = 0xffffffff;
  aplStack_310[0] = (node_ptr)0x0;
  aplStack_310[1] = (node_ptr)0x0;
  uStack_300._0_4_ = 0;
  local_2f8 = (_Bit_pointer)CONCAT44(local_2f8._4_4_,0xffffffff);
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_2e0 = 1;
  local_2d8 = 0xffffffff;
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_2c0 = 2;
  local_2b8.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2b8.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  local_2b8.super_Row_hook.super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_2b8.rowIndex_ = 5;
  local_298.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_298.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  local_298.super_Row_hook.super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_298.rowIndex_ = 6;
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
              *)local_318,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
              *)local_278);
  lVar10 = 0x88;
  do {
    lVar1 = *(long *)(local_318 + lVar10);
    if (lVar1 != 0) {
      plVar2 = *(long **)((long)aplStack_310 + lVar10);
      *plVar2 = lVar1;
      *(long **)(lVar1 + 8) = plVar2;
      *(undefined8 *)(local_318 + lVar10) = 0;
      *(undefined8 *)((long)aplStack_310 + lVar10) = 0;
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x18);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,&setcont);
  local_318._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_350,local_318);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x327);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)local_340 - (int)local_350) * 8 + local_338;
  local_380 = matrix;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&(pVVar3->column_).
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        (pVVar3->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_00177097;
    }
    aplStack_310[1] = (node_ptr)0x0;
    uStack_300._0_4_ = 0;
    uStack_300._4_4_ = 0;
    local_318 = (undefined1  [8])0x0;
    aplStack_310[0] = (node_ptr)0x0;
    local_2f8 = (_Bit_pointer)0x0;
  }
  else {
LAB_00177097:
    local_378 = (undefined **)((ulong)local_378 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_318,(long)(int)uVar13,(bool *)&local_378
               ,(allocator_type *)&local_398);
    ppEVar12 = (pVVar3->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar12 !=
        *(pointer *)
         ((long)&(pVVar3->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar13 <= (*ppEVar12)->rowIndex_) break;
        local_378 = (undefined **)CONCAT44(local_378._4_4_,(*ppEVar12)->rowIndex_);
        cVar11 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&(pVVar3->erasedValues_)._M_h,(key_type *)&local_378);
        if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) =
               *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) |
               1L << ((byte)(*ppEVar12)->rowIndex_ & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 !=
               *(pointer *)
                ((long)&(pVVar3->column_).
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1.super__Bit_iterator_base._M_offset = (uint)uStack_300;
  __last1.super__Bit_iterator_base._M_p = (_Bit_type *)aplStack_310[1];
  if ((ulong)(uint)uStack_300 + ((long)aplStack_310[1] - (long)local_318) * 8 ==
      (ulong)local_338 + (local_340 - (long)local_350) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p = (_Bit_type *)local_318;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = (_Bit_type *)local_350;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1,__last1,__first2);
  }
  else {
    bVar9 = false;
  }
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar9);
  local_268 = (node_ptr)0x0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_360 = &local_398;
  local_398 = "matrix[0].get_content(veccont.size()) == veccont";
  local_390 = "";
  local_370 = 0;
  local_378 = &PTR__lazy_ostream_002093b0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_378,&local_60,0x327,1,0,0);
  pvVar8 = local_380;
  boost::detail::shared_count::~shared_count(&sStack_260);
  if (local_318 != (undefined1  [8])0x0) {
    operator_delete((void *)local_318,(long)local_2f8 - (long)local_318);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x329);
  local_268 = (node_ptr)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_358 = ((long)*(pointer *)
                      ((long)&(pVVar3->column_).
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&(pVVar3->column_).
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              (pVVar3->erasedValues_)._M_h._M_element_count;
  local_320 = &local_358;
  local_328 = &local_39c;
  local_398 = (char *)CONCAT71(local_398._1_7_,local_358 == 3);
  local_39c = 3;
  local_390 = (char *)0x0;
  sStack_388.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  uStack_300 = &local_320;
  aplStack_310[0] = (node_ptr)((ulong)aplStack_310[0] & 0xffffffffffffff00);
  local_318 = (undefined1  [8])&PTR__lazy_ostream_00209400;
  aplStack_310[1] = (node_ptr)&boost::unit_test::lazy_ostream::inst;
  local_360 = (char **)&local_328;
  local_370 = 0;
  local_378 = &PTR__lazy_ostream_002096c0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_388);
  local_318._0_4_ = 0xffffffff;
  aplStack_310[0] = (node_ptr)0x0;
  aplStack_310[1] = (node_ptr)0x0;
  uStack_300._0_4_ = 0;
  local_2f8 = (_Bit_pointer)CONCAT44(local_2f8._4_4_,0xffffffff);
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_2e0 = 1;
  local_2d8 = 0xffffffff;
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_2c0 = 2;
  local_2b8.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2b8.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  local_2b8.super_Row_hook.super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_2b8.rowIndex_ = 5;
  local_298.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_298.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  local_298.super_Row_hook.super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_298.rowIndex_ = 6;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
              *)local_318,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
              *)local_278);
  lVar10 = 0x88;
  do {
    lVar1 = *(long *)(local_318 + lVar10);
    if (lVar1 != 0) {
      plVar2 = *(long **)((long)aplStack_310 + lVar10);
      *plVar2 = lVar1;
      *(long **)(lVar1 + 8) = plVar2;
      *(undefined8 *)(local_318 + lVar10) = 0;
      *(undefined8 *)((long)aplStack_310 + lVar10) = 0;
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x18);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)((pvVar8->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1),&setcont);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_350,0,0);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x330);
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)local_340 - (int)local_350) * 8 + local_338;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[1].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        pVVar3[1].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_001774fb;
    }
    aplStack_310[1] = (node_ptr)0x0;
    uStack_300._0_4_ = 0;
    uStack_300._4_4_ = 0;
    local_318 = (undefined1  [8])0x0;
    aplStack_310[0] = (node_ptr)0x0;
    local_2f8 = (_Bit_pointer)0x0;
  }
  else {
LAB_001774fb:
    local_378 = (undefined **)((ulong)local_378 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_318,(long)(int)uVar13,(bool *)&local_378
               ,(allocator_type *)&local_398);
    ppEVar12 = pVVar3[1].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar12 !=
        *(pointer *)
         ((long)&pVVar3[1].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar13 <= (*ppEVar12)->rowIndex_) break;
        local_378 = (undefined **)CONCAT44(local_378._4_4_,(*ppEVar12)->rowIndex_);
        cVar11 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&pVVar3[1].erasedValues_._M_h,(key_type *)&local_378);
        if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) =
               *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) |
               1L << ((byte)(*ppEVar12)->rowIndex_ & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 !=
               *(pointer *)
                ((long)&pVVar3[1].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_00.super__Bit_iterator_base._M_offset = (uint)uStack_300;
  __last1_00.super__Bit_iterator_base._M_p = (_Bit_type *)aplStack_310[1];
  if ((ulong)(uint)uStack_300 + ((long)aplStack_310[1] - (long)local_318) * 8 ==
      (ulong)local_338 + (local_340 - (long)local_350) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_318;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_350;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar9 = false;
  }
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar9);
  local_268 = (node_ptr)0x0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_398 = "matrix[1].get_content(veccont.size()) == veccont";
  local_390 = "";
  local_370 = 0;
  local_378 = &PTR__lazy_ostream_002093b0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_360 = &local_398;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_378,&local_b0,0x330,1,0,0);
  pvVar8 = local_380;
  boost::detail::shared_count::~shared_count(&sStack_260);
  if (local_318 != (undefined1  [8])0x0) {
    operator_delete((void *)local_318,(long)local_2f8 - (long)local_318);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x332);
  local_268 = (node_ptr)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_358 = ((long)*(pointer *)
                      ((long)&pVVar3[1].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[1].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[1].erasedValues_._M_h._M_element_count;
  local_398 = (char *)CONCAT71(local_398._1_7_,local_358 == 0);
  local_39c = 0;
  local_390 = (char *)0x0;
  sStack_388.pi_ = (sp_counted_base *)0x0;
  aplStack_310[0] = (node_ptr)((ulong)aplStack_310[0] & 0xffffffffffffff00);
  local_370 = 0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_320 = &local_358;
  local_318 = (undefined1  [8])&PTR__lazy_ostream_00209400;
  aplStack_310[1] = (node_ptr)&boost::unit_test::lazy_ostream::inst;
  uStack_300 = &local_320;
  local_328 = &local_39c;
  local_378 = &PTR__lazy_ostream_002096c0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_360 = (char **)&local_328;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_388);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)((pvVar8->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),&setcont);
  local_318._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_350,local_318);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x338);
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)local_340 - (int)local_350) * 8 + local_338;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[4].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        pVVar3[4].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_001778d1;
    }
    aplStack_310[1] = (node_ptr)0x0;
    uStack_300 = (long **)0x0;
    local_318 = (undefined1  [8])0x0;
    aplStack_310[0] = (node_ptr)0x0;
    local_2f8 = (_Bit_pointer)0x0;
  }
  else {
LAB_001778d1:
    local_378 = (undefined **)((ulong)local_378 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_318,(long)(int)uVar13,(bool *)&local_378
               ,(allocator_type *)&local_398);
    ppEVar12 = pVVar3[4].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar12 !=
        *(pointer *)
         ((long)&pVVar3[4].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar13 <= (*ppEVar12)->rowIndex_) break;
        local_378 = (undefined **)CONCAT44(local_378._4_4_,(*ppEVar12)->rowIndex_);
        cVar11 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&pVVar3[4].erasedValues_._M_h,(key_type *)&local_378);
        if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) =
               *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) |
               1L << ((byte)(*ppEVar12)->rowIndex_ & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 !=
               *(pointer *)
                ((long)&pVVar3[4].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_01.super__Bit_iterator_base._M_offset = (uint)uStack_300;
  __last1_01.super__Bit_iterator_base._M_p = (_Bit_type *)aplStack_310[1];
  if (((ulong)uStack_300 & 0xffffffff) + ((long)aplStack_310[1] - (long)local_318) * 8 ==
      (ulong)local_338 + (local_340 - (long)local_350) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_318;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_350;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar9 = false;
  }
  pvVar8 = local_380;
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar9);
  local_268 = (node_ptr)0x0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_398 = "matrix[4].get_content(veccont.size()) == veccont";
  local_390 = "";
  local_370 = 0;
  local_378 = &PTR__lazy_ostream_002093b0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_360 = &local_398;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_378,&local_100,0x338,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if (local_318 != (undefined1  [8])0x0) {
    operator_delete((void *)local_318,(long)local_2f8 - (long)local_318);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x33a);
  local_268 = (node_ptr)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_358 = ((long)*(pointer *)
                      ((long)&pVVar3[4].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[4].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[4].erasedValues_._M_h._M_element_count;
  local_398 = (char *)CONCAT71(local_398._1_7_,local_358 == 3);
  local_39c = 3;
  local_390 = (char *)0x0;
  sStack_388.pi_ = (sp_counted_base *)0x0;
  aplStack_310[0] = (node_ptr)((ulong)aplStack_310[0] & 0xffffffffffffff00);
  local_370 = 0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_320 = &local_358;
  local_318 = (undefined1  [8])&PTR__lazy_ostream_00209400;
  aplStack_310[1] = (node_ptr)&boost::unit_test::lazy_ostream::inst;
  uStack_300 = &local_320;
  local_328 = &local_39c;
  local_378 = &PTR__lazy_ostream_002096c0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_360 = (char **)&local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_398,&local_270,&local_250,0x33a,1,2,2,"matrix[4].size()",local_318,"3",
             &local_378);
  boost::detail::shared_count::~shared_count(&sStack_388);
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
              *)0x0,(Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                     *)0x0);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)((pvVar8->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&setcont);
  local_318._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_350,local_318);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x340);
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)local_340 - (int)local_350) * 8 + local_338;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        pVVar3[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_00177cbd;
    }
    aplStack_310[1] = (node_ptr)0x0;
    uStack_300 = (long **)0x0;
    local_318 = (undefined1  [8])0x0;
    aplStack_310[0] = (node_ptr)0x0;
    local_2f8 = (_Bit_pointer)0x0;
  }
  else {
LAB_00177cbd:
    local_378 = (undefined **)((ulong)local_378 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_318,(long)(int)uVar13,(bool *)&local_378
               ,(allocator_type *)&local_398);
    ppEVar12 = pVVar3[5].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar12 !=
        *(pointer *)
         ((long)&pVVar3[5].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar13 <= (*ppEVar12)->rowIndex_) break;
        local_378 = (undefined **)CONCAT44(local_378._4_4_,(*ppEVar12)->rowIndex_);
        cVar11 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&pVVar3[5].erasedValues_._M_h,(key_type *)&local_378);
        if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) =
               *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) |
               1L << ((byte)(*ppEVar12)->rowIndex_ & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 !=
               *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_02.super__Bit_iterator_base._M_offset = (uint)uStack_300;
  __last1_02.super__Bit_iterator_base._M_p = (_Bit_type *)aplStack_310[1];
  if (((ulong)uStack_300 & 0xffffffff) + ((long)aplStack_310[1] - (long)local_318) * 8 ==
      (ulong)local_338 + (local_340 - (long)local_350) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_318;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_350;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar9 = false;
  }
  pvVar8 = local_380;
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar9);
  local_268 = (node_ptr)0x0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_398 = "matrix[5].get_content(veccont.size()) == veccont";
  local_390 = "";
  local_370 = 0;
  local_378 = &PTR__lazy_ostream_002093b0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  local_360 = &local_398;
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_378,&local_150,0x340,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if (local_318 != (undefined1  [8])0x0) {
    operator_delete((void *)local_318,(long)local_2f8 - (long)local_318);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x342);
  local_268 = (node_ptr)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_358 = ((long)*(pointer *)
                      ((long)&pVVar3[5].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[5].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[5].erasedValues_._M_h._M_element_count;
  local_398 = (char *)CONCAT71(local_398._1_7_,local_358 == 5);
  local_39c = 5;
  local_390 = (char *)0x0;
  sStack_388.pi_ = (sp_counted_base *)0x0;
  aplStack_310[0] = (node_ptr)((ulong)aplStack_310[0] & 0xffffffffffffff00);
  local_370 = 0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_320 = &local_358;
  local_318 = (undefined1  [8])&PTR__lazy_ostream_00209400;
  aplStack_310[1] = (node_ptr)&boost::unit_test::lazy_ostream::inst;
  uStack_300 = &local_320;
  local_328 = &local_39c;
  local_378 = &PTR__lazy_ostream_002096c0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_360 = (char **)&local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_398,&local_270,&local_250,0x342,1,2,2,"matrix[5].size()",local_318,"5",
             &local_378);
  boost::detail::shared_count::~shared_count(&sStack_388);
  local_318._0_4_ = 0xffffffff;
  aplStack_310[0] = (node_ptr)0x0;
  aplStack_310[1] = (node_ptr)0x0;
  uStack_300._0_4_ = 2;
  local_2f8 = (_Bit_pointer)CONCAT44(local_2f8._4_4_,0xffffffff);
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_2e0 = 3;
  local_2d8 = 0xffffffff;
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_2c0 = 6;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
              *)local_318,&local_2b8);
  lVar10 = 0x48;
  do {
    lVar1 = *(long *)(local_318 + lVar10);
    if (lVar1 != 0) {
      plVar2 = *(long **)((long)aplStack_310 + lVar10);
      *plVar2 = lVar1;
      *(long **)(lVar1 + 8) = plVar2;
      *(undefined8 *)(local_318 + lVar10) = 0;
      *(undefined8 *)((long)aplStack_310 + lVar10) = 0;
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x18);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)((pvVar8->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&setcont);
  local_318._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_350,local_318);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x348);
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)local_340 - (int)local_350) * 8 + local_338;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        pVVar3[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_0017812d;
    }
    aplStack_310[1] = (node_ptr)0x0;
    uStack_300._0_4_ = 0;
    uStack_300._4_4_ = 0;
    local_318 = (undefined1  [8])0x0;
    aplStack_310[0] = (node_ptr)0x0;
    local_2f8 = (_Bit_pointer)0x0;
  }
  else {
LAB_0017812d:
    local_378 = (undefined **)((ulong)local_378 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_318,(long)(int)uVar13,(bool *)&local_378
               ,(allocator_type *)&local_398);
    ppEVar12 = pVVar3[5].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar12 !=
        *(pointer *)
         ((long)&pVVar3[5].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar13 <= (*ppEVar12)->rowIndex_) break;
        local_378 = (undefined **)CONCAT44(local_378._4_4_,(*ppEVar12)->rowIndex_);
        cVar11 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&pVVar3[5].erasedValues_._M_h,(key_type *)&local_378);
        if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) =
               *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) |
               1L << ((byte)(*ppEVar12)->rowIndex_ & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 !=
               *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_03.super__Bit_iterator_base._M_offset = (uint)uStack_300;
  __last1_03.super__Bit_iterator_base._M_p = (_Bit_type *)aplStack_310[1];
  if ((ulong)(uint)uStack_300 + ((long)aplStack_310[1] - (long)local_318) * 8 ==
      (ulong)local_338 + (local_340 - (long)local_350) * 8) {
    __first1_03.super__Bit_iterator_base._8_8_ = 0;
    __first1_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_318;
    __last1_03.super__Bit_iterator_base._12_4_ = 0;
    __first2_03.super__Bit_iterator_base._8_8_ = 0;
    __first2_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_350;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_03,__last1_03,__first2_03);
  }
  else {
    bVar9 = false;
  }
  pvVar8 = local_380;
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar9);
  local_268 = (node_ptr)0x0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_398 = "matrix[5].get_content(veccont.size()) == veccont";
  local_390 = "";
  local_370 = 0;
  local_378 = &PTR__lazy_ostream_002093b0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  local_360 = &local_398;
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_378,&local_1a0,0x348,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if (local_318 != (undefined1  [8])0x0) {
    operator_delete((void *)local_318,(long)local_2f8 - (long)local_318);
  }
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x34a);
  local_268 = (node_ptr)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_358 = ((long)*(pointer *)
                      ((long)&pVVar3[5].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[5].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[5].erasedValues_._M_h._M_element_count;
  local_398 = (char *)CONCAT71(local_398._1_7_,local_358 == 4);
  local_39c = 4;
  local_390 = (char *)0x0;
  sStack_388.pi_ = (sp_counted_base *)0x0;
  aplStack_310[0] = (node_ptr)((ulong)aplStack_310[0] & 0xffffffffffffff00);
  local_370 = 0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_320 = &local_358;
  local_318 = (undefined1  [8])&PTR__lazy_ostream_00209400;
  aplStack_310[1] = (node_ptr)&boost::unit_test::lazy_ostream::inst;
  uStack_300 = &local_320;
  local_328 = &local_39c;
  local_378 = &PTR__lazy_ostream_002096c0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_360 = (char **)&local_328;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_388);
  local_318._0_4_ = 0xffffffff;
  aplStack_310[0] = (node_ptr)0x0;
  aplStack_310[1] = (node_ptr)0x0;
  uStack_300._0_4_ = 0;
  local_2f8 = (_Bit_pointer)CONCAT44(local_2f8._4_4_,0xffffffff);
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_2e0 = 1;
  local_2d8 = 0xffffffff;
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_2c0 = 3;
  local_2b8.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2b8.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  local_2b8.super_Row_hook.super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_2b8.rowIndex_ = 5;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
              *)local_318,&local_298);
  lVar10 = 0x68;
  do {
    lVar1 = *(long *)(local_318 + lVar10);
    if (lVar1 != 0) {
      plVar2 = *(long **)((long)aplStack_310 + lVar10);
      *plVar2 = lVar1;
      *(long **)(lVar1 + 8) = plVar2;
      *(undefined8 *)(local_318 + lVar10) = 0;
      *(undefined8 *)((long)aplStack_310 + lVar10) = 0;
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x18);
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppEVar12 = pVVar3[3].column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = *(pointer *)
             ((long)&pVVar3[3].column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                     ._M_impl + 8);
  if (ppEVar12 != ppEVar4) {
    do {
      pEVar5 = *ppEVar12;
      if (((pVVar3[3].super_Row_access_option.rows_ != (Row_container *)0x0) ||
          (pEVar5 != (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                      *)0x0)) &&
         (plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
         plVar6 != (node_ptr)0x0)) {
        plVar7 = *(node_ptr *)((long)&(pEVar5->super_Row_hook).super_type.super_type + 8);
        plVar7->next_ = plVar6;
        plVar6->prev_ = plVar7;
      }
      operator_delete(pEVar5,0x20);
      ppEVar12 = ppEVar12 + 1;
    } while (ppEVar12 != ppEVar4);
    ppEVar12 = pVVar3[3].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pVVar3[3].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                 ._M_impl + 8) != ppEVar12) {
      *(pointer *)
       ((long)&pVVar3[3].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl + 8) = ppEVar12;
    }
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&pVVar3[3].erasedValues_._M_h);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)(pVVar3 + 3),&setcont);
  local_318._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_350,local_318);
  pvVar8 = local_380;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x350);
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)local_340 - (int)local_350) * 8 + local_338;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[3].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 ==
        pVVar3[3].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      aplStack_310[1] = (node_ptr)0x0;
      uStack_300._0_4_ = 0;
      uStack_300._4_4_ = 0;
      local_318 = (undefined1  [8])0x0;
      aplStack_310[0] = (node_ptr)0x0;
      local_2f8 = (_Bit_pointer)0x0;
      goto LAB_001786d2;
    }
    uVar13 = ppEVar12[-1]->rowIndex_ + 1;
  }
  local_378 = (undefined **)((ulong)local_378 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_318,(long)(int)uVar13,(bool *)&local_378,
             (allocator_type *)&local_398);
  ppEVar12 = pVVar3[3].column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar12 !=
      *(pointer *)
       ((long)&pVVar3[3].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl + 8)) {
    do {
      if (uVar13 <= (*ppEVar12)->rowIndex_) break;
      local_378 = (undefined **)CONCAT44(local_378._4_4_,(*ppEVar12)->rowIndex_);
      cVar11 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&pVVar3[3].erasedValues_._M_h,(key_type *)&local_378);
      if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) =
             *(ulong *)((long)local_318 + (ulong)((*ppEVar12)->rowIndex_ >> 6) * 8) |
             1L << ((byte)(*ppEVar12)->rowIndex_ & 0x3f);
      }
      ppEVar12 = ppEVar12 + 1;
    } while (ppEVar12 !=
             *(pointer *)
              ((long)&pVVar3[3].column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                      ._M_impl + 8));
  }
LAB_001786d2:
  __last1_04.super__Bit_iterator_base._M_offset = (uint)uStack_300;
  __last1_04.super__Bit_iterator_base._M_p = (_Bit_type *)aplStack_310[1];
  if ((ulong)(uint)uStack_300 + ((long)aplStack_310[1] - (long)local_318) * 8 ==
      (ulong)local_338 + (local_340 - (long)local_350) * 8) {
    __first1_04.super__Bit_iterator_base._8_8_ = 0;
    __first1_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_318;
    __last1_04.super__Bit_iterator_base._12_4_ = 0;
    __first2_04.super__Bit_iterator_base._8_8_ = 0;
    __first2_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_350;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_04,__last1_04,__first2_04);
  }
  else {
    bVar9 = false;
  }
  pvVar8 = local_380;
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar9);
  local_268 = (node_ptr)0x0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_398 = "matrix[3].get_content(veccont.size()) == veccont";
  local_390 = "";
  local_370 = 0;
  local_378 = &PTR__lazy_ostream_002093b0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_360 = &local_398;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_378,&local_1f0,0x350,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if (local_318 != (undefined1  [8])0x0) {
    operator_delete((void *)local_318,(long)local_2f8 - (long)local_318);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x352);
  local_268 = (node_ptr)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar8->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_358 = ((long)*(pointer *)
                      ((long)&pVVar3[3].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[3].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[3].erasedValues_._M_h._M_element_count;
  local_398 = (char *)CONCAT71(local_398._1_7_,local_358 == 4);
  local_39c = 4;
  local_390 = (char *)0x0;
  sStack_388.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_320 = &local_358;
  aplStack_310[0] = (node_ptr)((ulong)aplStack_310[0] & 0xffffffffffffff00);
  local_318 = (undefined1  [8])&PTR__lazy_ostream_00209400;
  aplStack_310[1] = (node_ptr)&boost::unit_test::lazy_ostream::inst;
  uStack_300 = &local_320;
  local_328 = &local_39c;
  local_370 = 0;
  local_378 = &PTR__lazy_ostream_002096c0;
  local_368 = &boost::unit_test::lazy_ostream::inst;
  local_360 = (char **)&local_328;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_388);
  if (local_350 != (void *)0x0) {
    operator_delete(local_350,local_330 - (long)local_350);
  }
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  ::~_Rb_tree(&setcont._M_t);
  return;
}

Assistant:

void column_test_base_z2_operators(std::vector<Column>& matrix) {
  std::set<typename Column::Entry> setcont;
  std::vector<bool> veccont;

  setcont = {0, 1, 2, 5, 6};
  matrix[0] += setcont;

  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 3);
  }

  setcont = {0, 1, 2, 5, 6};
  matrix[1] += setcont;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(1, setcont);
  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 3);
  }
  // this = this + column * v
  setcont = {};
  matrix[5].multiply_source_and_add(setcont, 1);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  setcont = {2, 3, 6};
  matrix[5].multiply_source_and_add(setcont, 1);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 4);
  }
  // this = v * this + column
  setcont = {0, 1, 3, 5};
  matrix[3].multiply_target_and_add(0, setcont);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 4);
  }
}